

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>::
IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  bool bVar1;
  shared_ptr<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_> *__r;
  shared_ptr<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_> *in_RDI;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *unaff_retaddr;
  uchar *in_stack_00000008;
  
  bVar1 = AtEnd(unaff_retaddr);
  if (!bVar1) {
    std::
    get<0ul,testing::internal::ParamIterator<unsigned_char>,testing::internal::ParamIterator<void(*)(short_const*,int*,int,txfm_param*)>>
              ((tuple<testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
                *)0x9d3fca);
    __r = (shared_ptr<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
           *)ParamIterator<unsigned_char>::operator*((ParamIterator<unsigned_char> *)0x9d3fd2);
    std::
    get<1ul,testing::internal::ParamIterator<unsigned_char>,testing::internal::ParamIterator<void(*)(short_const*,int*,int,txfm_param*)>>
              ((tuple<testing::internal::ParamIterator<unsigned_char>,_testing::internal::ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
                *)0x9d3fe4);
    ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>::operator*
              ((ParamIterator<void_(*)(const_short_*,_int_*,_int,_txfm_param_*)> *)0x9d3fec);
    std::
    make_shared<std::tuple<unsigned_char,void(*)(short_const*,int*,int,txfm_param*)>,unsigned_char_const&,void(*const&)(short_const*,int*,int,txfm_param*)>
              (in_stack_00000008,(_func_void_short_ptr_int_ptr_int_txfm_param_ptr **)unaff_retaddr);
    std::shared_ptr<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>::
    operator=(in_RDI,__r);
    std::shared_ptr<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>::
    ~shared_ptr((shared_ptr<std::tuple<unsigned_char,_void_(*)(const_short_*,_int_*,_int,_txfm_param_*)>_>
                 *)0x9d401a);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }